

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

LightLeSample * __thiscall
pbrt::PointLight::SampleLe
          (PointLight *this,Point2f *u1,Point2f *u2,SampledWavelengths *lambda,Float time)

{
  SampledWavelengths *in_RSI;
  LightLeSample *in_RDI;
  Float in_XMM0_Da;
  undefined1 auVar1 [64];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  Point3<float> PVar9;
  Vector3f VVar10;
  SampledSpectrum SVar11;
  Ray ray;
  Transform *in_stack_000000b0;
  Point3f p;
  float *s;
  Ray *ray_00;
  undefined4 in_stack_ffffffffffffff08;
  LightLeSample *this_00;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  undefined1 local_a8 [168];
  undefined1 auVar5 [56];
  undefined1 auVar8 [56];
  
  s = (in_RSI->pdf).values + 2;
  ray_00 = (Ray *)(local_a8 + 100);
  auVar5 = SUB6456(ZEXT1664((undefined1  [16])0x0),8);
  auVar8 = SUB6456(ZEXT1664((undefined1  [16])0x0),8);
  local_a8._124_4_ = in_XMM0_Da;
  Point3<float>::Point3((Point3<float> *)ray_00,(float)((ulong)s >> 0x20),SUB84(s,0),0.0);
  PVar9 = Transform::operator()
                    (in_stack_000000b0,
                     (Point3<float> *)
                     ray.medium.
                     super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                     .bits);
  local_a8._88_4_ = PVar9.super_Tuple3<pbrt::Point3,_float>.z;
  auVar1._0_8_ = PVar9.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar1._8_56_ = auVar5;
  local_a8._80_8_ = vmovlpd_avx(auVar1._0_16_);
  local_a8._112_8_ = local_a8._80_8_;
  local_a8._120_4_ = local_a8._88_4_;
  VVar10 = SampleUniformSphere((Point2f *)
                               CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  local_a8._16_4_ = VVar10.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar2._0_8_ = VVar10.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar2._8_56_ = auVar5;
  local_a8._8_8_ = vmovlpd_avx(auVar2._0_16_);
  this_00 = (LightLeSample *)local_a8;
  local_a8._24_8_ = local_a8._8_8_;
  local_a8._32_4_ = local_a8._16_4_;
  MediumHandle::MediumHandle((MediumHandle *)ray_00,(MediumHandle *)s);
  Ray::Ray((Ray *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),(Point3f *)in_RSI,
           (Vector3f *)this_00,(Float)local_a8._124_4_,(MediumHandle *)ray_00);
  auVar5 = (undefined1  [56])0x0;
  SVar11 = DenselySampledSpectrum::Sample
                     ((DenselySampledSpectrum *)
                      CONCAT44(in_RSI[6].lambda.values[0],in_stack_ffffffffffffff20),in_RSI);
  auVar6._0_8_ = SVar11.values.values._8_8_;
  auVar6._8_56_ = auVar8;
  auVar3._0_8_ = SVar11.values.values._0_8_;
  auVar3._8_56_ = auVar5;
  auVar5 = (undefined1  [56])0x0;
  vmovlpd_avx(auVar3._0_16_);
  vmovlpd_avx(auVar6._0_16_);
  SVar11 = pbrt::operator*((Float)((ulong)ray_00 >> 0x20),(SampledSpectrum *)s);
  auVar7._0_8_ = SVar11.values.values._8_8_;
  auVar7._8_56_ = auVar8;
  auVar4._0_8_ = SVar11.values.values._0_8_;
  auVar4._8_56_ = auVar5;
  vmovlpd_avx(auVar4._0_16_);
  vmovlpd_avx(auVar7._0_16_);
  UniformSpherePDF();
  LightLeSample::LightLeSample
            (this_00,(SampledSpectrum *)CONCAT44(local_a8._124_4_,in_stack_ffffffffffffff08),ray_00,
             (Float)((ulong)s >> 0x20),SUB84(s,0));
  return in_RDI;
}

Assistant:

LightLeSample PointLight::SampleLe(const Point2f &u1, const Point2f &u2,
                                   SampledWavelengths &lambda, Float time) const {
    Point3f p = renderFromLight(Point3f(0, 0, 0));
    Ray ray(p, SampleUniformSphere(u1), time, mediumInterface.outside);
    return LightLeSample(scale * I.Sample(lambda), ray, 1, UniformSpherePDF());
}